

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastpfor.h
# Opt level: O3

void __thiscall
FastPForLib::FastPForImpl<4U,_unsigned_int>::FastPForImpl
          (FastPForImpl<4U,_unsigned_int> *this,uint32_t ps)

{
  pointer __s;
  uint32_t uVar1;
  allocator_type local_19;
  
  this->PageSize = ps;
  uVar1 = 0x20 - LZCOUNT(ps);
  if (ps == 0) {
    uVar1 = 0;
  }
  this->bitsPageSize = uVar1;
  (this->datatobepacked).
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->datatobepacked).
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->datatobepacked).
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __s = (pointer)operator_new(0x318);
  (this->datatobepacked).
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = __s;
  (this->datatobepacked).
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = __s + 0x21;
  memset(__s,0,0x318);
  (this->datatobepacked).
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = __s + 0x21;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&this->bytescontainer,(ulong)((this->PageSize * 3 >> 7) + this->PageSize),&local_19);
  return;
}

Assistant:

FastPForImpl(uint32_t ps = 65536)
      : PageSize(ps),
        bitsPageSize(gccbits(PageSize)),
        datatobepacked(sizeof(IntType) * 8 + 1),
        bytescontainer(PageSize + 3 * PageSize / BlockSize) {
    assert(ps / BlockSize * BlockSize == ps);
    assert(gccbits(static_cast<uint32_t>(BlockSizeInUnitsOfPackSize * PACKSIZE - 1)) <= 8);
  }